

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O1

int X509V3_NAME_from_section(X509_NAME *nm,stack_st_CONF_VALUE *dn_sk,ulong chtype)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  byte *pbVar7;
  byte *pbVar8;
  bool bVar9;
  
  if (nm == (X509_NAME *)0x0) {
    return 0;
  }
  sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)dn_sk);
  bVar9 = sVar4 == 0;
  if (!bVar9) {
    sVar4 = 0;
    do {
      pvVar5 = OPENSSL_sk_value((OPENSSL_STACK *)dn_sk,sVar4);
      pbVar7 = *(byte **)((long)pvVar5 + 8);
      pbVar2 = pbVar7;
      do {
        while( true ) {
          pbVar8 = pbVar2 + 1;
          bVar1 = *pbVar2;
          pbVar2 = pbVar8;
          if (bVar1 < 0x2e) break;
          if ((bVar1 == 0x3a) || (bVar1 == 0x2e)) goto LAB_0021d7e3;
        }
        if (bVar1 == 0) goto LAB_0021d7ea;
      } while (bVar1 != 0x2c);
LAB_0021d7e3:
      if (*pbVar8 != 0) {
        pbVar7 = pbVar8;
      }
LAB_0021d7ea:
      iVar3 = X509_NAME_add_entry_by_txt
                        (nm,(char *)(pbVar7 + (*pbVar7 == 0x2b)),(int)chtype,
                         *(uchar **)((long)pvVar5 + 0x10),-1,-1,-(uint)(*pbVar7 == 0x2b));
      if (iVar3 == 0) break;
      sVar4 = sVar4 + 1;
      sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)dn_sk);
      bVar9 = sVar6 <= sVar4;
    } while (!bVar9);
  }
  return (uint)bVar9;
}

Assistant:

int X509V3_NAME_from_section(X509_NAME *nm, const STACK_OF(CONF_VALUE) *dn_sk,
                             int chtype) {
  if (!nm) {
    return 0;
  }

  for (size_t i = 0; i < sk_CONF_VALUE_num(dn_sk); i++) {
    const CONF_VALUE *v = sk_CONF_VALUE_value(dn_sk, i);
    const char *type = v->name;
    // Skip past any leading X. X: X, etc to allow for multiple instances
    for (const char *p = type; *p; p++) {
      if ((*p == ':') || (*p == ',') || (*p == '.')) {
        p++;
        if (*p) {
          type = p;
        }
        break;
      }
    }
    int mval;
    if (*type == '+') {
      mval = -1;
      type++;
    } else {
      mval = 0;
    }
    if (!X509_NAME_add_entry_by_txt(nm, type, chtype, (unsigned char *)v->value,
                                    -1, -1, mval)) {
      return 0;
    }
  }
  return 1;
}